

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

void SHA512_Last(SHA512_CTX *context)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  sha2_word64 *ptr;
  sha2_word64 tmp_1;
  sha2_word64 tmp;
  uint usedspace;
  SHA512_CTX *context_local;
  
  uVar2 = context->bitcount[0] >> 3;
  uVar1 = (uint)uVar2 & 0x7f;
  uVar3 = context->bitcount[0] >> 0x20 | context->bitcount[0] << 0x20;
  uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
  context->bitcount[0] = (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
  uVar3 = context->bitcount[1] >> 0x20 | context->bitcount[1] << 0x20;
  uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
  context->bitcount[1] = (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
  if ((uVar2 & 0x7f) == 0) {
    memset(context->buffer,0,0x70);
    context->buffer[0] = 0x80;
  }
  else {
    uVar4 = uVar1 + 1;
    context->buffer[uVar1] = 0x80;
    if (uVar4 < 0x71) {
      memset(context->buffer + uVar4,0,(ulong)(0x70 - uVar4));
    }
    else {
      if (uVar4 < 0x80) {
        memset(context->buffer + uVar4,0,(ulong)(0x80 - uVar4));
      }
      SHA512_Transform(context,(sha2_word64 *)context->buffer);
      memset(context->buffer,0,0x7e);
    }
  }
  *(uint64_t *)(context->buffer + 0x70) = context->bitcount[1];
  *(uint64_t *)(context->buffer + 0x78) = context->bitcount[0];
  SHA512_Transform(context,(sha2_word64 *)context->buffer);
  return;
}

Assistant:

void SHA512_Last(SHA512_CTX* context) {
	unsigned int	usedspace;

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->bitcount[0],context->bitcount[0]);
	REVERSE64(context->bitcount[1],context->bitcount[1]);
#endif
	if (usedspace > 0) {
		/* Begin padding with a 1 bit: */
		context->buffer[usedspace++] = 0x80;

		if (usedspace <= SHA512_SHORT_BLOCK_LENGTH) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->buffer[usedspace], SHA512_SHORT_BLOCK_LENGTH - usedspace);
		} else {
			if (usedspace < SHA512_BLOCK_LENGTH) {
				MEMSET_BZERO(&context->buffer[usedspace], SHA512_BLOCK_LENGTH - usedspace);
			}
			/* Do second-to-last transform: */
			SHA512_Transform(context, (sha2_word64*)context->buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->buffer, SHA512_BLOCK_LENGTH - 2);
		}
	} else {
		/* Prepare for final transform: */
		MEMSET_BZERO(context->buffer, SHA512_SHORT_BLOCK_LENGTH);

		/* Begin padding with a 1 bit: */
		*context->buffer = 0x80;
	}
	/* Store the length of input data (in bits): */
    sha2_word64 *ptr = (sha2_word64*)(&context->buffer[SHA512_SHORT_BLOCK_LENGTH]);
    *ptr = context->bitcount[1];
    ptr = (sha2_word64*)(&context->buffer[SHA512_SHORT_BLOCK_LENGTH+8]);
    *ptr = context->bitcount[0];

	/* Final transform: */
	SHA512_Transform(context, (sha2_word64*)context->buffer);
}